

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npbminput.cc
# Opt level: O0

int __thiscall NpbmInput::open(NpbmInput *this,char *__file,int __oflag,...)

{
  istream *piVar1;
  _Ios_Iostate __a;
  ImageSpec *pIVar2;
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  NpbmInput *in_stack_00000008;
  NpbmInput *in_stack_00000070;
  
  if ((this->super_ImageInput).isp == (istream *)0x0) {
    __assert_fail("isp != nullptr && \"istream not initialized\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/npbm.imageio/npbminput.cc"
                  ,0x5d,"virtual void NpbmInput::open(ImageSpec &)");
  }
  std::__cxx11::string::operator=((string *)&this->currentLine,"");
  this->pos = 0;
  piVar1 = (this->super_ImageInput).isp;
  pIVar2 = (ImageSpec *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18));
  __a = std::operator|(_S_failbit,_S_badbit);
  std::operator|(__a,_S_eofbit);
  std::ios::exceptions((_Ios_Iostate)pIVar2);
  readImageHeaders(in_stack_00000070);
  seekSubimage(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  spec((NpbmInput *)0x33368d);
  pIVar2 = ImageSpec::operator=((ImageSpec *)this,pIVar2);
  return (int)pIVar2;
}

Assistant:

void
NpbmInput::open(ImageSpec& newspec)
{
    assert(isp != nullptr && "istream not initialized");
    currentLine = "";
    pos         = 0;

    isp->exceptions(std::istream::failbit | std::istream::badbit | std::istream::eofbit );
    readImageHeaders();
    seekSubimage(0);
    newspec = spec();
}